

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O0

void Abc_ManResubCollectDivs_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vInternal)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *vInternal_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pNode);
    pAVar2 = Abc_ObjFanin0(pNode);
    Abc_ManResubCollectDivs_rec(pAVar2,vInternal);
    pAVar2 = Abc_ObjFanin1(pNode);
    Abc_ManResubCollectDivs_rec(pAVar2,vInternal);
    if ((*(uint *)&pNode->field_0x14 >> 4 & 1) == 0) {
      Vec_PtrPush(vInternal,pNode);
    }
  }
  return;
}

Assistant:

void Abc_ManResubCollectDivs_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vInternal )
{
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return;
    Abc_NodeSetTravIdCurrent(pNode);
    // collect the fanins
    Abc_ManResubCollectDivs_rec( Abc_ObjFanin0(pNode), vInternal );
    Abc_ManResubCollectDivs_rec( Abc_ObjFanin1(pNode), vInternal );
    // collect the internal node
    if ( pNode->fMarkA == 0 ) 
        Vec_PtrPush( vInternal, pNode );
}